

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder_init_from_memory__internal
                    (ma_decoding_backend_vtable *pVTable,void *pVTableUserData,void *pData,
                    size_t dataSize,ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_result mVar1;
  ma_data_source *pBackend;
  ma_decoding_backend_config backendConfig;
  
  if (pVTable->onInitMemory !=
      (_func_ma_result_void_ptr_void_ptr_size_t_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
       *)0x0) {
    backendConfig.seekPointCount = pConfig->seekPointCount;
    backendConfig.preferredFormat = pConfig->format;
    mVar1 = (*pVTable->onInitMemory)
                      (pVTableUserData,pData,dataSize,&backendConfig,&pDecoder->allocationCallbacks,
                       &pBackend);
    if (mVar1 == MA_SUCCESS) {
      pDecoder->pBackend = pBackend;
      pDecoder->pBackendVTable = pVTable;
      pDecoder->pBackendUserData = pConfig->pCustomBackendUserData;
      mVar1 = MA_SUCCESS;
    }
    return mVar1;
  }
  return MA_NOT_IMPLEMENTED;
}

Assistant:

static ma_result ma_decoder_init_from_memory__internal(const ma_decoding_backend_vtable* pVTable, void* pVTableUserData, const void* pData, size_t dataSize, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoding_backend_config backendConfig;
    ma_data_source* pBackend;

    MA_ASSERT(pVTable  != NULL);
    MA_ASSERT(pConfig  != NULL);
    MA_ASSERT(pDecoder != NULL);

    if (pVTable->onInitMemory == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    backendConfig = ma_decoding_backend_config_init(pConfig->format, pConfig->seekPointCount);

    result = pVTable->onInitMemory(pVTableUserData, pData, dataSize, &backendConfig, &pDecoder->allocationCallbacks, &pBackend);
    if (result != MA_SUCCESS) {
        return result;  /* Failed to initialize the backend from this vtable. */
    }

    /* Getting here means we were able to initialize the backend so we can now initialize the decoder. */
    pDecoder->pBackend         = pBackend;
    pDecoder->pBackendVTable   = pVTable;
    pDecoder->pBackendUserData = pConfig->pCustomBackendUserData;

    return MA_SUCCESS;
}